

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_test_tests.cpp
# Opt level: O2

int Test_x_iutest_x_ParamTest_TestSuiteInstantiationRegister(void)

{
  int iVar1;
  UnitTest *pUVar2;
  ParamTestSuiteInfo<ParamTest> *this;
  allocator<char> local_69;
  string local_68;
  string local_48;
  string local_28;
  
  pUVar2 = iutest::UnitTest::instance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"ParamTest",&local_69);
  iutest::detail::package_name_server<iuTest_TestSuitePackage>::getname_abi_cxx11_();
  this = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<ParamTest>
                   (&pUVar2->m_param_testsuite_holder,&local_68,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Test",(allocator<char> *)&local_68);
  iVar1 = iutest::detail::ParamTestSuiteInfo<ParamTest>::AddTestSuiteInstantiation
                    (this,&local_48,s_Test_x_iutest_x_ParamTest_EvalGenerator_,
                     s_Test_x_iutest_x_ParamTest_ParamGenerator__abi_cxx11_,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/list_test_tests.cpp"
                     ,0x20);
  std::__cxx11::string::~string((string *)&local_48);
  return iVar1;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest, A)
{
}